

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O1

void __thiscall
miniros::NodeHandle::setParam
          (NodeHandle *this,string *key,vector<float,_std::allocator<float>_> *vec)

{
  TopicManagerPtr *pTVar1;
  string local_50;
  MasterLink *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  pTVar1 = TopicManager::instance();
  TopicManager::getMasterLink
            ((pTVar1->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  resolveName(&local_50,this,key,true);
  MasterLink::set(local_30,&local_50,vec);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void NodeHandle::setParam(const std::string& key, const std::vector<float>& vec) const
{
  return getMasterLink()->set(resolveName(key), vec);
}